

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O3

void __thiscall
iDynTree::estimateExternalWrenchesBuffers::estimateExternalWrenchesBuffers
          (estimateExternalWrenchesBuffers *this,size_t nrOfSubModels,size_t nrOfLinks)

{
  (this->b).
  super__Vector_base<iDynTree::VectorFixSize<6U>,_std::allocator<iDynTree::VectorFixSize<6U>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->b).
  super__Vector_base<iDynTree::VectorFixSize<6U>,_std::allocator<iDynTree::VectorFixSize<6U>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->x).super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->x).super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->A).super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->x).super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->A).super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->A).super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->b).
  super__Vector_base<iDynTree::VectorFixSize<6U>,_std::allocator<iDynTree::VectorFixSize<6U>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iDynTree::LinkWrenches::LinkWrenches(&this->b_contacts_subtree,0);
  iDynTree::LinkPositions::LinkPositions(&this->subModelBase_H_link,0);
  resize(this,nrOfSubModels,nrOfLinks);
  return;
}

Assistant:

estimateExternalWrenchesBuffers::estimateExternalWrenchesBuffers(const size_t nrOfSubModels, const size_t nrOfLinks)
{
    resize(nrOfSubModels,nrOfLinks);
}